

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O1

Ref<embree::XML> __thiscall embree::XML::child(XML *this,string *childID)

{
  pointer pcVar1;
  pointer __s2;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  _func_int *__n;
  int iVar4;
  runtime_error *this_00;
  long *plVar5;
  size_type *psVar6;
  long *plVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = childID[4]._M_dataplus._M_p;
  lVar8 = childID[4]._M_string_length - (long)pcVar1;
  bVar11 = lVar8 != 0;
  if (bVar11) {
    uVar9 = lVar8 >> 3;
    __s2 = (in_RDX->_M_dataplus)._M_p;
    p_Var2 = (_func_int *)in_RDX->_M_string_length;
    uVar10 = 1;
    do {
      pp_Var3 = *(_func_int ***)(pcVar1 + uVar10 * 8 + -8);
      __n = pp_Var3[7];
      if (__n == p_Var2) {
        if (__n != (_func_int *)0x0) {
          iVar4 = bcmp(pp_Var3[6],__s2,(size_t)__n);
          if (iVar4 != 0) goto LAB_0018f581;
        }
        (this->super_RefCount)._vptr_RefCount = pp_Var3;
        if (pp_Var3 != (_func_int **)0x0) {
          (**(code **)(*pp_Var3 + 0x10))(pp_Var3);
        }
        if (bVar11) {
          return (Ref<embree::XML>)this;
        }
        break;
      }
LAB_0018f581:
      bVar11 = uVar10 < uVar9;
      lVar8 = (-(ulong)(uVar9 == 0) - uVar9) + uVar10;
      uVar10 = uVar10 + 1;
    } while (lVar8 != 0);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_70,(ParseLocation *)&childID->field_2);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_b0._M_dataplus._M_p = (pointer)*plVar5;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar6) {
    local_b0.field_2._M_allocated_capacity = *psVar6;
    local_b0.field_2._8_8_ = plVar5[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar6;
  }
  local_b0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::operator+(&local_50,&local_b0,in_RDX);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (long *)*plVar5;
  plVar7 = plVar5 + 2;
  if (local_90 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_90);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Ref<XML> child(const std::string& childID) const 
    {
      for (size_t i=0; i<children.size(); i++)
        if (children[i]->name == childID) return children[i];
      THROW_RUNTIME_ERROR (loc.str()+": XML node has no child \"" + childID + "\"");
    }